

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void InitializeDeviceInfo(PaDeviceInfo *deviceInfo)

{
  PaDeviceInfo *deviceInfo_local;
  
  deviceInfo->structVersion = -1;
  deviceInfo->name = (char *)0x0;
  deviceInfo->hostApi = -1;
  deviceInfo->maxInputChannels = 0;
  deviceInfo->maxOutputChannels = 0;
  deviceInfo->defaultLowInputLatency = -1.0;
  deviceInfo->defaultLowOutputLatency = -1.0;
  deviceInfo->defaultHighInputLatency = -1.0;
  deviceInfo->defaultHighOutputLatency = -1.0;
  deviceInfo->defaultSampleRate = -1.0;
  return;
}

Assistant:

static void InitializeDeviceInfo( PaDeviceInfo *deviceInfo )
{
    deviceInfo->structVersion = -1;
    deviceInfo->name = NULL;
    deviceInfo->hostApi = -1;
    deviceInfo->maxInputChannels = 0;
    deviceInfo->maxOutputChannels = 0;
    deviceInfo->defaultLowInputLatency = -1.;
    deviceInfo->defaultLowOutputLatency = -1.;
    deviceInfo->defaultHighInputLatency = -1.;
    deviceInfo->defaultHighOutputLatency = -1.;
    deviceInfo->defaultSampleRate = -1.;
}